

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O0

void __thiscall ObjectFileDB::process_link_data(ObjectFileDB *this)

{
  Stats combined_stats;
  Timer process_link_timer;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  anon_class_8_1_6ea51d23 in_stack_ffffffffffffffd0;
  
  printf("- Processing Link Data...\n");
  Timer::Timer((Timer *)0x193314);
  LinkedObjectFile::Stats::Stats((Stats *)&local_70);
  for_each_obj<ObjectFileDB::process_link_data()::__0>
            ((ObjectFileDB *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffd0);
  printf("Processed Link Data:\n");
  printf(" code %d bytes\n",(ulong)local_70);
  printf(" v2 code %d bytes\n",(ulong)local_6c);
  printf(" v2 link data %d bytes\n",(ulong)local_60);
  printf(" v2 pointers %d\n",(ulong)local_68);
  printf(" v2 pointer seeks %d\n",(ulong)local_64);
  printf(" v2 symbols %d\n",(ulong)local_58);
  printf(" v2 symbol links %d\n",(ulong)local_5c);
  printf(" v3 code %d bytes\n",(ulong)local_54);
  printf(" v3 link data %d bytes\n",(ulong)local_40);
  printf(" v3 pointers %d\n",(ulong)local_50);
  printf("   split %d\n",(ulong)local_4c);
  printf("   word  %d\n",(ulong)local_48);
  printf(" v3 pointer seeks %d\n",(ulong)local_44);
  printf(" v3 symbols %d\n",(ulong)local_3c);
  printf(" v3 offset symbol links %d\n",(ulong)in_stack_ffffffffffffffc8);
  printf(" v3 word symbol links %d\n",(ulong)in_stack_ffffffffffffffcc);
  Timer::getMs((Timer *)0x19346f);
  printf(" total %.3f ms\n");
  printf("\n");
  return;
}

Assistant:

void ObjectFileDB::process_link_data() {
  printf("- Processing Link Data...\n");
  Timer process_link_timer;

  LinkedObjectFile::Stats combined_stats;

  for_each_obj([&](ObjectFileData& obj) {
    obj.linked_data = to_linked_object_file(obj.data, obj.record.name);
    combined_stats.add(obj.linked_data.stats);
  });

  printf("Processed Link Data:\n");
  printf(" code %d bytes\n", combined_stats.total_code_bytes);
  printf(" v2 code %d bytes\n", combined_stats.total_v2_code_bytes);
  printf(" v2 link data %d bytes\n", combined_stats.total_v2_link_bytes);
  printf(" v2 pointers %d\n", combined_stats.total_v2_pointers);
  printf(" v2 pointer seeks %d\n", combined_stats.total_v2_pointer_seeks);
  printf(" v2 symbols %d\n", combined_stats.total_v2_symbol_count);
  printf(" v2 symbol links %d\n", combined_stats.total_v2_symbol_links);

  printf(" v3 code %d bytes\n", combined_stats.v3_code_bytes);
  printf(" v3 link data %d bytes\n", combined_stats.v3_link_bytes);
  printf(" v3 pointers %d\n", combined_stats.v3_pointers);
  printf("   split %d\n", combined_stats.v3_split_pointers);
  printf("   word  %d\n", combined_stats.v3_word_pointers);
  printf(" v3 pointer seeks %d\n", combined_stats.v3_pointer_seeks);
  printf(" v3 symbols %d\n", combined_stats.v3_symbol_count);
  printf(" v3 offset symbol links %d\n", combined_stats.v3_symbol_link_offset);
  printf(" v3 word symbol links %d\n", combined_stats.v3_symbol_link_word);

  printf(" total %.3f ms\n", process_link_timer.getMs());
  printf("\n");
}